

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

BGZF * bgzf_open_ref(char *fn,char *mode)

{
  int iVar1;
  BGZF *fp;
  char fai_file [4096];
  char acStack_1018 [4104];
  
  snprintf(acStack_1018,0x1000,"%s.fai",fn);
  iVar1 = access(acStack_1018,4);
  if ((iVar1 == 0) || (iVar1 = fai_build(fn), iVar1 == 0)) {
    fp = bgzf_open(fn,"r");
    if (fp == (BGZF *)0x0) {
      perror(fn);
    }
    else {
      if (((undefined1  [96])*fp & (undefined1  [96])0x60000000) != (undefined1  [96])0x20000000) {
        return fp;
      }
      iVar1 = bgzf_index_load(fp,fn,".gzi");
      if (-1 < iVar1) {
        return fp;
      }
      fprintf(_stderr,"Unable to load .gzi index \'%s.gzi\'\n",fn);
      bgzf_close(fp);
    }
  }
  return (BGZF *)0x0;
}

Assistant:

static BGZF *bgzf_open_ref(char *fn, char *mode) {
    BGZF *fp;
    char fai_file[PATH_MAX];

    snprintf(fai_file, PATH_MAX, "%s.fai", fn);
    if (access(fai_file, R_OK) != 0)
	if (fai_build(fn) != 0)
	    return NULL;

    if (!(fp = bgzf_open(fn, mode))) {
	perror(fn);
	return NULL;
    }

    if (fp->is_compressed == 1 && bgzf_index_load(fp, fn, ".gzi") < 0) {
	fprintf(stderr, "Unable to load .gzi index '%s.gzi'\n", fn);
	bgzf_close(fp);
	return NULL;
    }

    return fp;
}